

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  PrimRefMB *pPVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  int iVar25;
  size_t itime;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar58 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar59 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  vfloat4 a0;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar96;
  undefined1 auVar95 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  vfloat4 b1;
  undefined1 auVar105 [16];
  undefined4 uVar106;
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  ulong local_338;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  size_t local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  ulong local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 auStack_1f8 [16];
  anon_class_16_2_07cfa4d6 local_1e8;
  float local_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar28 = r->_begin;
  local_258 = SUB6416(ZEXT464(0x3f800000),0);
  auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
  local_338 = 0;
  auVar95 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar64._16_16_ = in_YmmResult._16_16_;
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
  auVar107 = ZEXT1664(auVar36);
  auVar64._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar108 = ZEXT1664(auVar64._0_16_);
  local_288 = SUB6416(ZEXT464(0x3f800000),0);
  local_298 = ZEXT816(0);
  local_2a8._8_4_ = 0xff800000;
  local_2a8._0_8_ = 0xff800000ff800000;
  local_2a8._12_4_ = 0xff800000;
  local_2b8._8_4_ = 0x7f800000;
  local_2b8._0_8_ = 0x7f8000007f800000;
  local_2b8._12_4_ = 0x7f800000;
  local_268._8_4_ = 0xff800000;
  local_268._0_8_ = 0xff800000ff800000;
  local_268._12_4_ = 0xff800000;
  local_2c8._8_4_ = 0xff800000;
  local_2c8._0_8_ = 0xff800000ff800000;
  local_2c8._12_4_ = 0xff800000;
  local_278._8_4_ = 0x7f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_278._12_4_ = 0x7f800000;
  local_2e8._8_4_ = 0x7f800000;
  local_2e8._0_8_ = 0x7f8000007f800000;
  local_2e8._12_4_ = 0x7f800000;
  local_2d8 = ZEXT816(0);
  local_2f0 = k;
LAB_01c46974:
  if (r->_end <= uVar28) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = local_2e8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds0.lower.field_0 + 8) = local_2e8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = local_2c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds0.upper.field_0 + 8) = local_2c8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = local_2b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds1.lower.field_0 + 8) = local_2b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = local_2a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds1.upper.field_0 + 8) = local_2a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_278._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_278._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_268._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_268._8_8_;
    BVar1 = (BBox1f)vmovlps_avx(local_258);
    __return_storage_ptr__->time_range = BVar1;
    (__return_storage_ptr__->object_range)._end = local_2d8._0_8_;
    __return_storage_ptr__->num_time_segments = local_2d8._8_8_;
    __return_storage_ptr__->max_num_time_segments = local_338;
    (__return_storage_ptr__->max_time_range).lower = (float)local_298._0_4_;
    (__return_storage_ptr__->max_time_range).upper = (float)local_288._0_4_;
    return __return_storage_ptr__;
  }
  BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar36._8_8_ = 0;
  auVar36._0_4_ = BVar1.lower;
  auVar36._4_4_ = BVar1.upper;
  auVar36 = vmovshdup_avx(auVar36);
  fVar81 = BVar1.lower;
  fVar14 = auVar36._0_4_ - fVar81;
  uVar24 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.field_0x68 * uVar28);
  uVar26 = (ulong)(uVar24 + 3);
  pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  if (uVar26 < (pBVar2->super_RawBufferView).num) {
    fVar79 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.fnumTimeSegments;
    auVar36 = ZEXT416((uint)(fVar79 * ((t0t1->upper - fVar81) / fVar14) * 0.99999976));
    auVar36 = vroundss_avx(auVar36,auVar36,10);
    auVar58 = vminss_avx(auVar36,ZEXT416((uint)fVar79));
    auVar36 = ZEXT416((uint)(fVar79 * ((t0t1->lower - fVar81) / fVar14) * 1.0000002));
    auVar36 = vroundss_avx(auVar36,auVar36,9);
    auVar36 = vmaxss_avx(auVar99._0_16_,auVar36);
    fVar14 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             maxRadiusScale;
    uStack_1d4 = SUB84(bezier_basis0._1632_8_,4);
    uStack_1d0 = bezier_basis0._1640_8_;
    uStack_1c8 = bezier_basis0._1648_8_;
    uStack_1c0 = bezier_basis0._1656_8_;
    pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             normals.items;
    lVar29 = (long)(int)auVar36._0_4_ * 0x38 + 0x10;
    uVar27 = (long)(int)auVar36._0_4_ - 1;
LAB_01c46adb:
    uVar27 = uVar27 + 1;
    if ((ulong)(long)(int)auVar58._0_4_ < uVar27) {
      local_1e8.primID = &local_210;
      fVar14 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
      fVar78 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.upper - fVar14;
      local_1d8 = (t0t1->lower - fVar14) / fVar78;
      fVar78 = (t0t1->upper - fVar14) / fVar78;
      fVar14 = fVar79 * local_1d8;
      fVar81 = fVar79 * fVar78;
      auVar55 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
      auVar41 = vroundss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),10);
      auVar36 = vmaxss_avx(auVar55,ZEXT816(0));
      local_208._0_4_ = auVar36._0_4_;
      auVar58 = vminss_avx(auVar41,ZEXT416((uint)fVar79));
      iVar31 = (int)auVar36._0_4_;
      fVar92 = auVar58._0_4_;
      iVar25 = (int)auVar55._0_4_;
      iVar33 = -1;
      if (-1 < iVar25) {
        iVar33 = iVar25;
      }
      iVar17 = (int)fVar79 + 1;
      if ((int)auVar41._0_4_ < (int)fVar79 + 1) {
        iVar17 = (int)auVar41._0_4_;
      }
      local_210 = uVar28;
      local_1e8.this = this;
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_1e8,(long)iVar31);
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_1e8,(long)(int)fVar92);
      auVar36 = auVar64._16_16_;
      fVar14 = fVar14 - (float)local_208._0_4_;
      if (iVar17 - iVar33 == 1) {
        auVar50 = ZEXT816(0) << 0x40;
        auVar58 = vmaxss_avx(ZEXT416((uint)fVar14),auVar50);
        fVar79 = auVar58._0_4_;
        fVar14 = 1.0 - fVar79;
        auVar44._0_4_ = fVar79 * bupper1.lower.field_0._0_4_;
        auVar44._4_4_ = fVar79 * bupper1.lower.field_0._4_4_;
        auVar44._8_4_ = fVar79 * bupper1.lower.field_0._8_4_;
        auVar44._12_4_ = fVar79 * bupper1.lower.field_0._12_4_;
        auVar39._4_4_ = fVar14;
        auVar39._0_4_ = fVar14;
        auVar39._8_4_ = fVar14;
        auVar39._12_4_ = fVar14;
        auVar58 = vfmadd231ps_fma(auVar44,auVar39,(undefined1  [16])blower0.lower.field_0);
        auVar45._0_4_ = fVar79 * bupper1.upper.field_0._0_4_;
        auVar45._4_4_ = fVar79 * bupper1.upper.field_0._4_4_;
        auVar45._8_4_ = fVar79 * bupper1.upper.field_0._8_4_;
        auVar45._12_4_ = fVar79 * bupper1.upper.field_0._12_4_;
        auVar55 = vfmadd231ps_fma(auVar45,(undefined1  [16])blower0.upper.field_0,auVar39);
        auVar41 = vmaxss_avx(ZEXT416((uint)(fVar92 - fVar81)),auVar50);
        fVar81 = auVar41._0_4_;
        fVar14 = 1.0 - fVar81;
        auVar42._0_4_ = fVar81 * blower0.lower.field_0._0_4_;
        auVar42._4_4_ = fVar81 * blower0.lower.field_0._4_4_;
        auVar42._8_4_ = fVar81 * blower0.lower.field_0._8_4_;
        auVar42._12_4_ = fVar81 * blower0.lower.field_0._12_4_;
        auVar40._4_4_ = fVar14;
        auVar40._0_4_ = fVar14;
        auVar40._8_4_ = fVar14;
        auVar40._12_4_ = fVar14;
        auVar41 = vfmadd231ps_fma(auVar42,auVar40,(undefined1  [16])bupper1.lower.field_0);
        auVar43._0_4_ = fVar81 * blower0.upper.field_0._0_4_;
        auVar43._4_4_ = fVar81 * blower0.upper.field_0._4_4_;
        auVar43._8_4_ = fVar81 * blower0.upper.field_0._8_4_;
        auVar43._12_4_ = fVar81 * blower0.upper.field_0._12_4_;
        auVar47 = vfmadd231ps_fma(auVar43,auVar40,(undefined1  [16])bupper1.upper.field_0);
      }
      else {
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_1e8,(long)(iVar31 + 1));
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  (&bupper0,&local_1e8,(long)((int)fVar92 + -1));
        auVar36 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40);
        fVar80 = auVar36._0_4_;
        fVar14 = 1.0 - fVar80;
        auVar54._0_4_ = fVar80 * blower1.lower.field_0.m128[0];
        auVar54._4_4_ = fVar80 * blower1.lower.field_0.m128[1];
        auVar54._8_4_ = fVar80 * blower1.lower.field_0.m128[2];
        auVar54._12_4_ = fVar80 * blower1.lower.field_0.m128[3];
        auVar50._4_4_ = fVar14;
        auVar50._0_4_ = fVar14;
        auVar50._8_4_ = fVar14;
        auVar50._12_4_ = fVar14;
        auVar58 = vfmadd231ps_fma(auVar54,auVar50,(undefined1  [16])blower0.lower.field_0);
        auVar53._0_4_ = fVar80 * blower1.upper.field_0.m128[0];
        auVar53._4_4_ = fVar80 * blower1.upper.field_0.m128[1];
        auVar53._8_4_ = fVar80 * blower1.upper.field_0.m128[2];
        auVar53._12_4_ = fVar80 * blower1.upper.field_0.m128[3];
        auVar55 = vfmadd231ps_fma(auVar53,auVar50,(undefined1  [16])blower0.upper.field_0);
        auVar36 = vmaxss_avx(ZEXT416((uint)(fVar92 - fVar81)),ZEXT816(0) << 0x40);
        fVar81 = auVar36._0_4_;
        fVar14 = 1.0 - fVar81;
        auVar57._0_4_ = fVar81 * bupper0.lower.field_0.m128[0];
        auVar57._4_4_ = fVar81 * bupper0.lower.field_0.m128[1];
        auVar57._8_4_ = fVar81 * bupper0.lower.field_0.m128[2];
        auVar57._12_4_ = fVar81 * bupper0.lower.field_0.m128[3];
        auVar51._4_4_ = fVar14;
        auVar51._0_4_ = fVar14;
        auVar51._8_4_ = fVar14;
        auVar51._12_4_ = fVar14;
        auVar41 = vfmadd231ps_fma(auVar57,auVar51,(undefined1  [16])bupper1.lower.field_0);
        auVar56._0_4_ = fVar81 * bupper0.upper.field_0.m128[0];
        auVar56._4_4_ = fVar81 * bupper0.upper.field_0.m128[1];
        auVar56._8_4_ = fVar81 * bupper0.upper.field_0.m128[2];
        auVar56._12_4_ = fVar81 * bupper0.upper.field_0.m128[3];
        auVar47 = vfmadd231ps_fma(auVar56,auVar51,(undefined1  [16])bupper1.upper.field_0);
        fVar78 = fVar78 - local_1d8;
        if (iVar25 < 0) {
          iVar25 = -1;
        }
        itime = (size_t)iVar25;
        while( true ) {
          auVar50 = ZEXT816(0) << 0x40;
          itime = itime + 1;
          auVar36 = auVar64._16_16_;
          if ((long)iVar17 <= (long)itime) break;
          fVar81 = ((float)(int)itime / fVar79 - local_1d8) / fVar78;
          fVar14 = 1.0 - fVar81;
          auVar38._0_4_ = auVar41._0_4_ * fVar81;
          fVar92 = auVar41._4_4_;
          auVar38._4_4_ = fVar92 * fVar81;
          fVar80 = auVar41._8_4_;
          auVar38._8_4_ = fVar80 * fVar81;
          fVar96 = auVar41._12_4_;
          auVar38._12_4_ = fVar96 * fVar81;
          auVar37._4_4_ = fVar14;
          auVar37._0_4_ = fVar14;
          auVar37._8_4_ = fVar14;
          auVar37._12_4_ = fVar14;
          auVar36 = vfmadd231ps_fma(auVar38,auVar37,auVar58);
          auVar52._0_4_ = auVar47._0_4_ * fVar81;
          auVar52._4_4_ = auVar47._4_4_ * fVar81;
          auVar52._8_4_ = auVar47._8_4_ * fVar81;
          auVar52._12_4_ = auVar47._12_4_ * fVar81;
          auVar50 = vfmadd231ps_fma(auVar52,auVar55,auVar37);
          _local_208 = auVar47;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_1e8,itime);
          local_328 = auVar55._0_4_;
          fStack_324 = auVar55._4_4_;
          fStack_320 = auVar55._8_4_;
          fStack_31c = auVar55._12_4_;
          local_318 = auVar58._0_4_;
          fStack_314 = auVar58._4_4_;
          fStack_310 = auVar58._8_4_;
          fStack_30c = auVar58._12_4_;
          auVar36 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar36);
          auVar58 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar50);
          auVar55 = vminps_avx(auVar36,ZEXT816(0) << 0x40);
          auVar36 = vmaxps_avx(auVar58,ZEXT816(0) << 0x40);
          auVar58._0_4_ = local_318 + auVar55._0_4_;
          auVar58._4_4_ = fStack_314 + auVar55._4_4_;
          auVar58._8_4_ = fStack_310 + auVar55._8_4_;
          auVar58._12_4_ = fStack_30c + auVar55._12_4_;
          auVar41._0_4_ = auVar41._0_4_ + auVar55._0_4_;
          auVar41._4_4_ = fVar92 + auVar55._4_4_;
          auVar41._8_4_ = fVar80 + auVar55._8_4_;
          auVar41._12_4_ = fVar96 + auVar55._12_4_;
          auVar55._0_4_ = local_328 + auVar36._0_4_;
          auVar55._4_4_ = fStack_324 + auVar36._4_4_;
          auVar55._8_4_ = fStack_320 + auVar36._8_4_;
          auVar55._12_4_ = fStack_31c + auVar36._12_4_;
          auVar47._0_4_ = (float)local_208._0_4_ + auVar36._0_4_;
          auVar47._4_4_ = (float)local_208._4_4_ + auVar36._4_4_;
          auVar47._8_4_ = fStack_200 + auVar36._8_4_;
          auVar47._12_4_ = fStack_1fc + auVar36._12_4_;
        }
      }
      auVar99 = ZEXT1664(auVar50);
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar58,ZEXT416(geomID),0x30);
      uVar24 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.numTimeSteps - 1;
      uVar27 = (ulong)uVar24;
      BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar46._8_8_ = 0;
      auVar46._0_4_ = BVar1.lower;
      auVar46._4_4_ = BVar1.upper;
      aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
               vinsertps_avx(auVar55,ZEXT416((uint)uVar28),0x30);
      aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
               vinsertps_avx(auVar41,ZEXT416(uVar24),0x30);
      aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
               vinsertps_avx(auVar47,ZEXT416(uVar24),0x30);
      auVar100._8_4_ = 0x3f000000;
      auVar100._0_8_ = 0x3f0000003f000000;
      auVar100._12_4_ = 0x3f000000;
      auVar48._0_4_ = aVar12.x * 0.5;
      auVar48._4_4_ = aVar12.y * 0.5;
      auVar48._8_4_ = aVar12.z * 0.5;
      auVar48._12_4_ = aVar12.field_3.w * 0.5;
      auVar58 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar10,auVar100);
      auVar93._0_4_ = aVar13.x * 0.5;
      auVar93._4_4_ = aVar13.y * 0.5;
      auVar93._8_4_ = aVar13.z * 0.5;
      auVar93._12_4_ = aVar13.field_3.w * 0.5;
      auVar55 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar11,auVar100);
      auVar49._0_4_ = auVar58._0_4_ + auVar55._0_4_;
      auVar49._4_4_ = auVar58._4_4_ + auVar55._4_4_;
      auVar49._8_4_ = auVar58._8_4_ + auVar55._8_4_;
      auVar49._12_4_ = auVar58._12_4_ + auVar55._12_4_;
      local_2e8 = vminps_avx(local_2e8,(undefined1  [16])aVar10);
      local_2c8 = vmaxps_avx(local_2c8,(undefined1  [16])aVar11);
      local_2b8 = vminps_avx(local_2b8,(undefined1  [16])aVar12);
      local_2a8 = vmaxps_avx(local_2a8,(undefined1  [16])aVar13);
      local_278 = vminps_avx(local_278,auVar49);
      local_268 = vmaxps_avx(local_268,auVar49);
      uVar26 = vcmpps_avx512vl(local_258,auVar46,1);
      auVar55 = vinsertps_avx(local_258,auVar46,0x50);
      auVar58 = vblendps_avx(auVar46,local_258,2);
      bVar35 = (bool)((byte)uVar26 & 1);
      bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
      local_258._4_4_ = (uint)bVar7 * auVar55._4_4_ | (uint)!bVar7 * auVar58._4_4_;
      local_258._0_4_ = (uint)bVar35 * auVar55._0_4_ | (uint)!bVar35 * auVar58._0_4_;
      local_258._8_4_ = (uint)bVar8 * auVar55._8_4_ | (uint)!bVar8 * auVar58._8_4_;
      local_258._12_4_ = (uint)bVar9 * auVar55._12_4_ | (uint)!bVar9 * auVar58._12_4_;
      auVar58 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar58 = vpinsrq_avx(auVar58,uVar27,1);
      local_2d8 = vpaddq_avx(local_2d8,auVar58);
      bVar35 = local_338 < uVar27;
      auVar58 = vmovshdup_avx(auVar46);
      auVar60._16_16_ = auVar36;
      auVar60._0_16_ = local_288;
      auVar59._4_28_ = auVar60._4_28_;
      auVar59._0_4_ = (uint)bVar35 * auVar58._0_4_ + (uint)!bVar35 * local_288._0_4_;
      local_288 = auVar59._0_16_;
      auVar62._16_16_ = auVar36;
      auVar62._0_16_ = local_298;
      auVar61._4_28_ = auVar62._4_28_;
      auVar61._0_4_ = (uint)bVar35 * (int)BVar1.lower + (uint)!bVar35 * local_298._0_4_;
      local_298 = auVar61._0_16_;
      if (local_338 <= uVar27) {
        local_338 = uVar27;
      }
      pPVar6 = prims->items;
      pPVar6[local_2f0].lbounds.bounds0.lower.field_0 = aVar10;
      pPVar6[local_2f0].lbounds.bounds0.upper.field_0 = aVar11;
      pPVar6[local_2f0].lbounds.bounds1.lower.field_0.field_1 = aVar12;
      pPVar6[local_2f0].lbounds.bounds1.upper.field_0.field_1 = aVar13;
      pPVar6[local_2f0].time_range = BVar1;
      auVar95 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
      auVar107 = ZEXT1664(auVar58);
      auVar64._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      auVar64._16_16_ = auVar36;
      auVar108 = ZEXT1664(auVar64._0_16_);
      local_2f0 = local_2f0 + 1;
      goto LAB_01c475a2;
    }
    lVar4 = *(long *)((long)pBVar2 + lVar29 + -0x10);
    lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar29);
    lVar34 = lVar5 * (ulong)uVar24;
    auVar55 = auVar95._0_16_;
    auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar34)),auVar55);
    if (auVar36._0_4_ < 1.844e+18) {
      lVar32 = lVar5 * (ulong)(uVar24 + 1);
      auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar32)),auVar55);
      if (auVar36._0_4_ < 1.844e+18) {
        lVar30 = lVar5 * (ulong)(uVar24 + 2);
        auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar30)),auVar55);
        if (auVar36._0_4_ < 1.844e+18) {
          auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar26)),auVar55);
          if (auVar36._0_4_ < 1.844e+18) {
            auVar36 = *(undefined1 (*) [16])(lVar4 + lVar34);
            auVar55 = auVar107._0_16_;
            uVar15 = vcmpps_avx512vl(auVar36,auVar55,6);
            auVar41 = auVar108._0_16_;
            uVar16 = vcmpps_avx512vl(auVar36,auVar41,1);
            if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
              auVar47 = *(undefined1 (*) [16])(lVar4 + lVar32);
              uVar15 = vcmpps_avx512vl(auVar47,auVar55,6);
              uVar16 = vcmpps_avx512vl(auVar47,auVar41,1);
              if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                auVar50 = *(undefined1 (*) [16])(lVar4 + lVar30);
                uVar15 = vcmpps_avx512vl(auVar50,auVar55,6);
                uVar16 = vcmpps_avx512vl(auVar50,auVar41,1);
                if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                  auVar51 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
                  auVar64._0_16_ = auVar51;
                  uVar15 = vcmpps_avx512vl(auVar51,auVar55,6);
                  uVar16 = vcmpps_avx512vl(auVar51,auVar41,1);
                  if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                    lVar4 = *(long *)((long)pBVar3 + lVar29 + -0x10);
                    lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar29);
                    auVar57 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)uVar24);
                    uVar15 = vcmpps_avx512vl(auVar57,auVar55,6);
                    uVar16 = vcmpps_avx512vl(auVar57,auVar41,1);
                    if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                      auVar56 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar24 + 1));
                      uVar15 = vcmpps_avx512vl(auVar56,auVar55,6);
                      uVar16 = vcmpps_avx512vl(auVar56,auVar41,1);
                      if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) goto code_r0x01c46c58;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_01c47582;
  }
  goto LAB_01c475a2;
code_r0x01c46c58:
  auVar55 = vshufps_avx(auVar36,auVar36,0xff);
  auVar54 = vinsertps_avx512f(auVar36,ZEXT416((uint)(auVar55._0_4_ * fVar14)),0x30);
  auVar36 = vshufps_avx(auVar47,auVar47,0xff);
  auVar53 = vinsertps_avx512f(auVar47,ZEXT416((uint)(auVar36._0_4_ * fVar14)),0x30);
  auVar36 = vshufps_avx(auVar50,auVar50,0xff);
  auVar52 = vinsertps_avx512f(auVar50,ZEXT416((uint)(auVar36._0_4_ * fVar14)),0x30);
  auVar36 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar51 = vinsertps_avx512f(auVar51,ZEXT416((uint)(auVar36._0_4_ * fVar14)),0x30);
  auVar97._8_4_ = 0x80000000;
  auVar97._0_8_ = 0x8000000080000000;
  auVar97._12_4_ = 0x80000000;
  auVar37 = vmulps_avx512vl(auVar51,auVar97);
  auVar36 = vfmadd213ps_avx512vl(ZEXT816(0),auVar52,auVar37);
  auVar36 = vaddps_avx512vl(auVar53,auVar36);
  auVar38 = vfmadd231ps_avx512vl(auVar36,auVar54,auVar97);
  auVar39 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar36 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar24 + 2));
  auVar55 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
  auVar40 = vmulps_avx512vl(auVar55,auVar97);
  auVar41 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar36,auVar40);
  auVar82._0_4_ = auVar56._0_4_ + auVar41._0_4_;
  auVar82._4_4_ = auVar56._4_4_ + auVar41._4_4_;
  auVar82._8_4_ = auVar56._8_4_ + auVar41._8_4_;
  auVar82._12_4_ = auVar56._12_4_ + auVar41._12_4_;
  auVar50 = vfmadd231ps_fma(auVar82,auVar57,auVar97);
  auVar93 = ZEXT816(0) << 0x40;
  auVar41 = vmulps_avx512vl(auVar51,auVar93);
  auVar94._8_4_ = 0x3f000000;
  auVar94._0_8_ = 0x3f0000003f000000;
  auVar94._12_4_ = 0x3f000000;
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar52,auVar94);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar53,auVar93);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar54,auVar94);
  auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar41 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar88._0_4_ = auVar42._0_4_ * auVar41._0_4_;
  auVar88._4_4_ = auVar42._4_4_ * auVar41._4_4_;
  auVar88._8_4_ = auVar42._8_4_ * auVar41._8_4_;
  auVar88._12_4_ = auVar42._12_4_ * auVar41._12_4_;
  auVar41 = vfmsub231ps_fma(auVar88,auVar47,auVar50);
  auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar50,auVar50,0x7f);
  auVar68._16_16_ = auVar64._16_16_;
  auVar68._0_16_ = auVar93;
  auVar69._4_28_ = auVar68._4_28_;
  auVar69._0_4_ = auVar41._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar93,auVar69._0_16_);
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  auVar45 = vmulss_avx512f(auVar45,auVar43);
  auVar43 = vmulss_avx512f(auVar43,auVar43);
  auVar43 = vmulss_avx512f(auVar45,auVar43);
  auVar43 = vaddss_avx512f(auVar44,auVar43);
  auVar43 = vbroadcastss_avx512vl(auVar43);
  auVar44 = vmulps_avx512vl(auVar50,auVar43);
  auVar45 = vmulps_avx512vl(auVar55,auVar93);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar36,auVar94);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar56,auVar93);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar57,auVar94);
  auVar46 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar46 = vmulps_avx512vl(auVar42,auVar46);
  auVar47 = vfmsub231ps_avx512vl(auVar46,auVar47,auVar45);
  auVar45 = vmulps_avx512vl(auVar39,auVar44);
  auVar46 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar44 = vmulps_avx512vl(auVar46,auVar44);
  auVar46 = vrcp14ss_avx512f(auVar93,auVar69._0_16_);
  auVar48 = vbroadcastss_avx512vl(auVar41);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar46,SUB6416(ZEXT464(0x40000000),0));
  auVar46 = vmulss_avx512f(auVar46,auVar41);
  auVar49 = vaddps_avx512vl(auVar38,auVar45);
  auVar41 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar47 = vmulps_avx512vl(auVar48,auVar41);
  auVar41 = vdpps_avx(auVar50,auVar41,0x7f);
  fVar81 = auVar41._0_4_;
  auVar89._0_4_ = fVar81 * auVar50._0_4_;
  auVar89._4_4_ = fVar81 * auVar50._4_4_;
  auVar89._8_4_ = fVar81 * auVar50._8_4_;
  auVar89._12_4_ = fVar81 * auVar50._12_4_;
  auVar75._8_4_ = 2;
  auVar75._0_8_ = 0x200000002;
  auVar75._12_4_ = 2;
  auVar75._16_4_ = 2;
  auVar75._20_4_ = 2;
  auVar75._24_4_ = 2;
  auVar75._28_4_ = 2;
  auVar59 = vpermps_avx512vl(auVar75,ZEXT1632(auVar49));
  fVar81 = auVar46._0_4_;
  auVar41 = vsubps_avx512vl(auVar47,auVar89);
  auVar83._0_4_ = fVar81 * auVar41._0_4_;
  auVar83._4_4_ = fVar81 * auVar41._4_4_;
  auVar83._8_4_ = fVar81 * auVar41._8_4_;
  auVar83._12_4_ = fVar81 * auVar41._12_4_;
  auVar41 = vmulps_avx512vl(auVar43,auVar83);
  auVar41 = vmulps_avx512vl(auVar39,auVar41);
  auVar50 = vaddps_avx512vl(auVar44,auVar41);
  auVar84._0_4_ = (auVar42._0_4_ + auVar50._0_4_) * 0.33333334;
  auVar84._4_4_ = (auVar42._4_4_ + auVar50._4_4_) * 0.33333334;
  auVar84._8_4_ = (auVar42._8_4_ + auVar50._8_4_) * 0.33333334;
  auVar84._12_4_ = (auVar42._12_4_ + auVar50._12_4_) * 0.33333334;
  auVar39 = vaddps_avx512vl(auVar49,auVar84);
  auVar60 = vpermps_avx512vl(auVar75,ZEXT1632(auVar39));
  auVar71._16_16_ = auVar60._16_16_;
  auVar37 = vaddps_avx512vl(auVar52,auVar37);
  auVar41 = vaddps_avx512vl(auVar36,auVar40);
  auVar41 = vfmadd231ps_fma(auVar41,auVar56,auVar93);
  auVar47 = vfmadd231ps_fma(auVar41,auVar57,auVar97);
  auVar41 = vmulps_avx512vl(auVar51,auVar94);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar93,auVar52);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar94,auVar53);
  auVar51 = vfmadd231ps_avx512vl(auVar41,auVar93,auVar54);
  auVar52 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar41 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar41 = vmulps_avx512vl(auVar51,auVar41);
  auVar41 = vfmsub231ps_fma(auVar41,auVar52,auVar47);
  auVar47 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar53 = vfmadd231ps_avx512vl(auVar37,auVar53,auVar93);
  auVar54 = vfmadd231ps_avx512vl(auVar53,auVar54,auVar97);
  fVar81 = auVar41._0_4_;
  auVar71._0_16_ = auVar93;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = fVar81;
  auVar53 = vrsqrt14ss_avx512f(auVar93,auVar70._0_16_);
  auVar37 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  auVar37 = vmulss_avx512f(auVar37,auVar53);
  auVar40 = vmulss_avx512f(auVar53,auVar53);
  auVar37 = vmulss_avx512f(auVar37,auVar40);
  auVar40 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar53 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar53 = vaddss_avx512f(auVar53,auVar37);
  auVar53 = vbroadcastss_avx512vl(auVar53);
  auVar37 = vmulps_avx512vl(auVar47,auVar53);
  auVar55 = vmulps_avx512vl(auVar55,auVar94);
  auVar36 = vfmadd231ps_avx512vl(auVar55,auVar93,auVar36);
  auVar43 = vmulps_avx512vl(auVar40,auVar37);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar94,auVar56);
  auVar56 = vaddps_avx512vl(auVar54,auVar43);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar93,auVar57);
  auVar55 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar55 = vmulps_avx512vl(auVar51,auVar55);
  auVar36 = vfmsub231ps_avx512vl(auVar55,auVar52,auVar36);
  auVar55 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar36 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar105._0_4_ = fVar81 * auVar36._0_4_;
  auVar105._4_4_ = fVar81 * auVar36._4_4_;
  auVar105._8_4_ = fVar81 * auVar36._8_4_;
  auVar105._12_4_ = fVar81 * auVar36._12_4_;
  auVar36 = vdpps_avx(auVar47,auVar36,0x7f);
  auVar57 = vmulps_avx512vl(auVar55,auVar37);
  fVar81 = auVar36._0_4_;
  auVar85._0_4_ = fVar81 * auVar47._0_4_;
  auVar85._4_4_ = fVar81 * auVar47._4_4_;
  auVar85._8_4_ = fVar81 * auVar47._8_4_;
  auVar85._12_4_ = fVar81 * auVar47._12_4_;
  auVar36 = vsubps_avx(auVar105,auVar85);
  auVar47 = vrcp14ss_avx512f(auVar93,auVar70._0_16_);
  auVar55 = vfnmadd213ss_fma(auVar41,auVar47,SUB6416(ZEXT464(0x40000000),0));
  fVar81 = auVar47._0_4_ * auVar55._0_4_;
  auVar86._0_4_ = auVar36._0_4_ * fVar81;
  auVar86._4_4_ = auVar36._4_4_ * fVar81;
  auVar86._8_4_ = auVar36._8_4_ * fVar81;
  auVar86._12_4_ = auVar36._12_4_ * fVar81;
  auVar36 = vmulps_avx512vl(auVar53,auVar86);
  auVar36 = vmulps_avx512vl(auVar40,auVar36);
  auVar103._0_4_ = auVar57._0_4_ + auVar36._0_4_;
  auVar103._4_4_ = auVar57._4_4_ + auVar36._4_4_;
  auVar103._8_4_ = auVar57._8_4_ + auVar36._8_4_;
  auVar103._12_4_ = auVar57._12_4_ + auVar36._12_4_;
  auVar36 = vaddps_avx512vl(auVar51,auVar103);
  auVar87._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar87._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar87._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar87._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar55 = vsubps_avx512vl(auVar56,auVar87);
  auVar64 = vpermps_avx2(auVar75,ZEXT1632(auVar55));
  auVar61 = vpermps_avx512vl(auVar75,ZEXT1632(auVar56));
  auVar23._8_8_ = bezier_basis0._3952_8_;
  auVar23._0_8_ = bezier_basis0._3944_8_;
  auVar23._16_8_ = bezier_basis0._3960_8_;
  auVar23._24_8_ = bezier_basis0._3968_8_;
  auVar62 = vmulps_avx512vl(auVar61,auVar23);
  auVar18._8_8_ = bezier_basis0._2796_8_;
  auVar18._0_8_ = bezier_basis0._2788_8_;
  auVar18._16_8_ = bezier_basis0._2804_8_;
  auVar18._24_8_ = bezier_basis0._2812_8_;
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar18,auVar64);
  auVar77._8_8_ = bezier_basis0._1640_8_;
  auVar77._0_8_ = bezier_basis0._1632_8_;
  auVar77._16_8_ = bezier_basis0._1648_8_;
  auVar77._24_8_ = bezier_basis0._1656_8_;
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar77,auVar60);
  auVar19._8_8_ = bezier_basis0._484_8_;
  auVar19._0_8_ = bezier_basis0._476_8_;
  auVar19._16_8_ = bezier_basis0._492_8_;
  auVar19._24_8_ = bezier_basis0._500_8_;
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar19,auVar59);
  auVar98._8_4_ = 0xff800000;
  auVar98._0_8_ = 0xff800000ff800000;
  auVar98._12_4_ = 0xff800000;
  auVar98._16_4_ = 0xff800000;
  auVar98._20_4_ = 0xff800000;
  auVar98._24_4_ = 0xff800000;
  auVar98._28_4_ = 0xff800000;
  auVar63 = vmaxps_avx512vl(auVar98,auVar62);
  auVar72._8_8_ = bezier_basis0._8576_8_;
  auVar72._0_8_ = bezier_basis0._8568_8_;
  auVar72._16_8_ = bezier_basis0._8584_8_;
  auVar72._24_8_ = bezier_basis0._8592_8_;
  fVar81 = (float)bezier_basis0._8568_8_;
  fVar78 = SUB84(bezier_basis0._8568_8_,4);
  auVar65._4_4_ = fVar78 * auVar61._4_4_;
  auVar65._0_4_ = fVar81 * auVar61._0_4_;
  fVar92 = (float)bezier_basis0._8576_8_;
  auVar65._8_4_ = fVar92 * auVar61._8_4_;
  fVar80 = SUB84(bezier_basis0._8576_8_,4);
  auVar65._12_4_ = fVar80 * auVar61._12_4_;
  fVar96 = (float)bezier_basis0._8584_8_;
  auVar65._16_4_ = fVar96 * auVar61._16_4_;
  fVar101 = SUB84(bezier_basis0._8584_8_,4);
  auVar65._20_4_ = fVar101 * auVar61._20_4_;
  fVar102 = (float)bezier_basis0._8592_8_;
  auVar65._24_4_ = fVar102 * auVar61._24_4_;
  auVar65._28_4_ = auVar61._28_4_;
  auVar20._8_8_ = bezier_basis0._7420_8_;
  auVar20._0_8_ = bezier_basis0._7412_8_;
  auVar20._16_8_ = bezier_basis0._7428_8_;
  auVar20._24_8_ = bezier_basis0._7436_8_;
  auVar36 = vfmadd231ps_fma(auVar65,auVar20,auVar64);
  auVar21._8_8_ = bezier_basis0._6264_8_;
  auVar21._0_8_ = bezier_basis0._6256_8_;
  auVar21._16_8_ = bezier_basis0._6272_8_;
  auVar21._24_8_ = bezier_basis0._6280_8_;
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar21,auVar60);
  auVar22._8_8_ = bezier_basis0._5108_8_;
  auVar22._0_8_ = bezier_basis0._5100_8_;
  auVar22._16_8_ = bezier_basis0._5116_8_;
  auVar22._24_8_ = bezier_basis0._5124_8_;
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar22,auVar59);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar59 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vblendps_avx(auVar59,ZEXT432(0) << 0x40,1);
  auVar60 = vsubps_avx512vl(auVar62,auVar64);
  auVar64 = vblendps_avx(auVar59,ZEXT432(0) << 0x40,0x80);
  auVar61 = vaddps_avx512vl(auVar62,auVar64);
  auVar64 = vmaxps_avx(auVar60,auVar61);
  auVar59 = vmaxps_avx(auVar63,auVar64);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar64 = vpermps_avx512vl(auVar66,ZEXT1632(auVar49));
  auVar63 = vpermps_avx512vl(auVar66,ZEXT1632(auVar39));
  auVar67 = vpermps_avx512vl(auVar66,ZEXT1632(auVar55));
  auVar68 = vpermps_avx512vl(auVar66,ZEXT1632(auVar56));
  auVar69 = vmulps_avx512vl(auVar68,auVar23);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar18,auVar67);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar77,auVar63);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar19,auVar64);
  auVar68 = vmulps_avx512vl(auVar68,auVar72);
  auVar67 = vfmadd231ps_avx512vl(auVar68,auVar20,auVar67);
  auVar68 = vmaxps_avx512vl(auVar98,auVar69);
  auVar63 = vfmadd231ps_avx512vl(auVar67,auVar21,auVar63);
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar22,auVar64);
  auVar63 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vblendps_avx(auVar63,ZEXT832(0),1);
  auVar67 = vsubps_avx512vl(auVar69,auVar64);
  auVar64 = vblendps_avx(auVar63,ZEXT832(0),0x80);
  auVar63 = vaddps_avx512vl(auVar69,auVar64);
  auVar64 = vmaxps_avx512vl(auVar67,auVar63);
  _local_208 = vmaxps_avx512vl(auVar68,auVar64);
  auVar64 = vbroadcastss_avx512vl(auVar49);
  auVar68 = vbroadcastss_avx512vl(auVar39);
  auVar73._0_4_ = auVar55._0_4_;
  auVar73._4_4_ = auVar73._0_4_;
  auVar73._8_4_ = auVar73._0_4_;
  auVar73._12_4_ = auVar73._0_4_;
  auVar73._16_4_ = auVar73._0_4_;
  auVar73._20_4_ = auVar73._0_4_;
  auVar73._24_4_ = auVar73._0_4_;
  auVar73._28_4_ = auVar73._0_4_;
  auVar70 = vbroadcastss_avx512vl(auVar56);
  auVar71 = vmulps_avx512vl(auVar70,auVar23);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar18,auVar73);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar68);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar19,auVar64);
  auVar72 = vmulps_avx512vl(auVar70,auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar20,auVar73);
  auVar70 = vmaxps_avx512vl(auVar98,auVar71);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar21,auVar68);
  auVar64 = vfmadd231ps_avx512vl(auVar72,auVar22,auVar64);
  auVar72 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vblendps_avx(auVar72,ZEXT832(0) << 0x20,1);
  auVar68 = vsubps_avx512vl(auVar71,auVar64);
  auVar64 = vblendps_avx(auVar72,ZEXT832(0) << 0x20,0x80);
  auVar72 = vaddps_avx512vl(auVar71,auVar64);
  auVar64 = vmaxps_avx512vl(auVar68,auVar72);
  auVar70 = vmaxps_avx512vl(auVar70,auVar64);
  auVar64 = vminps_avx(auVar60,auVar61);
  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar60 = vminps_avx512vl(auVar73,auVar62);
  auVar62 = vminps_avx512vl(auVar60,auVar64);
  auVar64 = vminps_avx512vl(auVar73,auVar69);
  auVar60 = vminps_avx512vl(auVar67,auVar63);
  auVar69 = vminps_avx512vl(auVar64,auVar60);
  auVar60 = vminps_avx512vl(auVar73,auVar71);
  auVar64 = vminps_avx(auVar68,auVar72);
  auVar72 = vminps_avx512vl(auVar60,auVar64);
  auVar41 = vsubps_avx(auVar38,auVar45);
  uVar106 = auVar41._0_4_;
  auVar74._4_4_ = uVar106;
  auVar74._0_4_ = uVar106;
  auVar74._8_4_ = uVar106;
  auVar74._12_4_ = uVar106;
  auVar74._16_4_ = uVar106;
  auVar74._20_4_ = uVar106;
  auVar74._24_4_ = uVar106;
  auVar74._28_4_ = uVar106;
  auVar36 = vsubps_avx(auVar42,auVar50);
  auVar90._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar90._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar90._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar90._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar47 = vaddps_avx512vl(auVar41,auVar90);
  auVar64 = vbroadcastss_avx512vl(auVar47);
  auVar50 = vsubps_avx512vl(auVar54,auVar43);
  auVar36 = vsubps_avx512vl(auVar51,auVar103);
  auVar91._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar91._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar91._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar91._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar51 = vsubps_avx512vl(auVar50,auVar91);
  auVar61 = vbroadcastss_avx512vl(auVar51);
  auVar67 = vbroadcastss_avx512vl(auVar50);
  auVar76._0_4_ = (float)bezier_basis0._3944_8_ * auVar67._0_4_;
  auVar76._4_4_ = SUB84(bezier_basis0._3944_8_,4) * auVar67._4_4_;
  auVar76._8_4_ = (float)bezier_basis0._3952_8_ * auVar67._8_4_;
  auVar76._12_4_ = SUB84(bezier_basis0._3952_8_,4) * auVar67._12_4_;
  auVar76._16_4_ = (float)bezier_basis0._3960_8_ * auVar67._16_4_;
  auVar76._20_4_ = SUB84(bezier_basis0._3960_8_,4) * auVar67._20_4_;
  auVar76._24_4_ = (float)bezier_basis0._3968_8_ * auVar67._24_4_;
  auVar76._28_4_ = 0;
  auVar36 = vfmadd231ps_fma(auVar76,auVar18,auVar61);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar77,auVar64);
  auVar68 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar19,auVar74);
  auVar60 = vmaxps_avx(auVar98,auVar68);
  auVar63._4_4_ = fVar78 * auVar67._4_4_;
  auVar63._0_4_ = fVar81 * auVar67._0_4_;
  auVar63._8_4_ = fVar92 * auVar67._8_4_;
  auVar63._12_4_ = fVar80 * auVar67._12_4_;
  auVar63._16_4_ = fVar96 * auVar67._16_4_;
  auVar63._20_4_ = fVar101 * auVar67._20_4_;
  auVar63._24_4_ = fVar102 * auVar67._24_4_;
  auVar63._28_4_ = auVar67._28_4_;
  auVar36 = vfmadd231ps_fma(auVar63,auVar20,auVar61);
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar21,auVar64);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar22,auVar74);
  auVar63 = vmulps_avx512vl(auVar64,auVar65);
  auVar104 = ZEXT832(0) << 0x20;
  auVar64 = vblendps_avx(auVar63,auVar104,1);
  auVar61 = vsubps_avx(auVar68,auVar64);
  auVar64 = vblendps_avx(auVar63,auVar104,0x80);
  auVar63 = vaddps_avx512vl(auVar68,auVar64);
  auVar64 = vmaxps_avx512vl(auVar61,auVar63);
  auVar64 = vmaxps_avx(auVar60,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar36 = vmaxps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar64 = vpermps_avx512vl(auVar66,ZEXT1632(auVar41));
  auVar60 = vpermps_avx512vl(auVar66,ZEXT1632(auVar47));
  auVar67 = vpermps_avx512vl(auVar66,ZEXT1632(auVar51));
  auVar71 = vpermps_avx512vl(auVar66,ZEXT1632(auVar50));
  auVar66 = vmulps_avx512vl(auVar71,auVar23);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar18,auVar67);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar60);
  auVar74 = vfmadd231ps_avx512vl(auVar66,auVar19,auVar64);
  auVar66._4_4_ = fVar78 * auVar71._4_4_;
  auVar66._0_4_ = fVar81 * auVar71._0_4_;
  auVar66._8_4_ = fVar92 * auVar71._8_4_;
  auVar66._12_4_ = fVar80 * auVar71._12_4_;
  auVar66._16_4_ = fVar96 * auVar71._16_4_;
  auVar66._20_4_ = fVar101 * auVar71._20_4_;
  auVar66._24_4_ = fVar102 * auVar71._24_4_;
  auVar66._28_4_ = auVar71._28_4_;
  auVar55 = vfmadd231ps_fma(auVar66,auVar20,auVar67);
  auVar66 = vmaxps_avx512vl(auVar98,auVar74);
  auVar60 = vfmadd231ps_avx512vl(ZEXT1632(auVar55),auVar21,auVar60);
  auVar64 = vfmadd231ps_avx512vl(auVar60,auVar22,auVar64);
  auVar60 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,1);
  auVar71 = vsubps_avx512vl(auVar74,auVar64);
  auVar64 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,0x80);
  auVar75 = vaddps_avx512vl(auVar74,auVar64);
  auVar64 = vmaxps_avx(auVar71,auVar75);
  auVar64 = vmaxps_avx(auVar66,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar55 = vmaxps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar55 = vunpcklps_avx(auVar36,auVar55);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = vpermps_avx512vl(auVar64,ZEXT1632(auVar41));
  auVar66 = vpermps_avx512vl(auVar64,ZEXT1632(auVar47));
  auVar76 = vpermps_avx512vl(auVar64,ZEXT1632(auVar51));
  auVar64 = vpermps_avx512vl(auVar64,ZEXT1632(auVar50));
  auVar67 = vmulps_avx512vl(auVar64,auVar23);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar18,auVar76);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar77,auVar66);
  auVar77 = vfmadd231ps_avx512vl(auVar67,auVar19,auVar60);
  auVar67._4_4_ = auVar64._4_4_ * fVar78;
  auVar67._0_4_ = auVar64._0_4_ * fVar81;
  auVar67._8_4_ = auVar64._8_4_ * fVar92;
  auVar67._12_4_ = auVar64._12_4_ * fVar80;
  auVar67._16_4_ = auVar64._16_4_ * fVar96;
  auVar67._20_4_ = auVar64._20_4_ * fVar101;
  auVar67._24_4_ = auVar64._24_4_ * fVar102;
  auVar67._28_4_ = auVar64._28_4_;
  auVar36 = vfmadd231ps_fma(auVar67,auVar20,auVar76);
  auVar67 = vmaxps_avx512vl(auVar98,auVar77);
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar21,auVar66);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar22,auVar60);
  auVar60 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vblendps_avx(auVar60,auVar104,1);
  auVar65 = vsubps_avx512vl(auVar77,auVar64);
  auVar64 = vblendps_avx(auVar60,auVar104,0x80);
  auVar66 = vaddps_avx512vl(auVar77,auVar64);
  auVar64 = vmaxps_avx(auVar65,auVar66);
  auVar64 = vmaxps_avx(auVar67,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vmaxps_avx(auVar64,auVar60);
  auVar36 = vmaxps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar36 = vinsertps_avx(auVar55,auVar36,0x28);
  auVar64 = vminps_avx512vl(auVar61,auVar63);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
  auVar107 = ZEXT1664(auVar50);
  auVar60 = vminps_avx512vl(auVar73,auVar68);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar55 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar64 = vminps_avx(auVar71,auVar75);
  auVar60 = vminps_avx512vl(auVar73,auVar74);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar108 = ZEXT1664(auVar51);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar41 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar41 = vunpcklps_avx(auVar55,auVar41);
  auVar64 = vminps_avx(auVar65,auVar66);
  auVar95 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar60 = vminps_avx512vl(auVar73,auVar77);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar60 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vminps_avx(auVar64,auVar60);
  auVar55 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar55 = vinsertps_avx(auVar41,auVar55,0x28);
  auVar64 = vshufps_avx512vl(auVar72,auVar72,0xb1);
  auVar60 = vminps_avx512vl(auVar72,auVar64);
  auVar64 = vshufpd_avx(auVar60,auVar60,5);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar41 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar64 = vshufps_avx512vl(auVar69,auVar69,0xb1);
  auVar60 = vminps_avx512vl(auVar69,auVar64);
  auVar64 = vshufpd_avx(auVar60,auVar60,5);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar47 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar47 = vunpcklps_avx(auVar41,auVar47);
  auVar64 = vshufps_avx512vl(auVar62,auVar62,0xb1);
  auVar60 = vminps_avx512vl(auVar62,auVar64);
  auVar64 = vshufpd_avx(auVar60,auVar60,5);
  auVar64 = vminps_avx(auVar60,auVar64);
  auVar41 = vminps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar41 = vinsertps_avx(auVar47,auVar41,0x28);
  auVar47 = vminps_avx(auVar55,auVar41);
  auVar64 = vshufps_avx512vl(auVar70,auVar70,0xb1);
  auVar64 = vmaxps_avx512vl(auVar70,auVar64);
  auVar60 = vshufpd_avx(auVar64,auVar64,5);
  auVar60 = vmaxps_avx(auVar64,auVar60);
  auVar55 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
  auVar60 = vshufps_avx(_local_208,_local_208,0xb1);
  auVar60 = vmaxps_avx(_local_208,auVar60);
  auVar61 = vshufpd_avx(auVar60,auVar60,5);
  auVar60 = vmaxps_avx(auVar60,auVar61);
  auVar41 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
  auVar41 = vunpcklps_avx(auVar55,auVar41);
  auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar59,auVar60);
  auVar60 = vshufpd_avx(auVar59,auVar59,5);
  auVar59 = vmaxps_avx(auVar59,auVar60);
  auVar55 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
  auVar55 = vinsertps_avx(auVar41,auVar55,0x28);
  auVar36 = vmaxps_avx(auVar36,auVar55);
  uVar15 = vcmpps_avx512vl(auVar36,auVar51,1);
  uVar16 = vcmpps_avx512vl(auVar47,auVar50,6);
  lVar29 = lVar29 + 0x38;
  if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) goto LAB_01c47582;
  goto LAB_01c46adb;
LAB_01c47582:
  auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_01c475a2:
  uVar28 = uVar28 + 1;
  goto LAB_01c46974;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }